

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O0

void remote_deq(Block *param_1,ProxyWithLink *cp,int nblocks)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  int *piVar1;
  MemoryBuffer *args_2;
  size_t sVar2;
  ExprLhs<const_int_&> expr;
  int in_EDX;
  Proxy *in_RSI;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  int recvd_data;
  size_t i;
  int received;
  vector<int,_std::allocator<int>_> incoming_gids;
  ITransientExpression *in_stack_fffffffffffffd08;
  Proxy *in_stack_fffffffffffffd10;
  AssertionHandler *this;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  ExprLhs<const_int_&> in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  SourceLineInfo *this_00;
  ExprLhs<const_int_&> in_stack_fffffffffffffd30;
  int *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  int *args_1;
  vector<int,_std::allocator<int>_> *args;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  FILE *in_stack_fffffffffffffd88;
  AssertionHandler local_230;
  int local_1c4;
  int local_1c0;
  int *local_1b8;
  SourceLineInfo local_170;
  StringRef local_160;
  int *local_100;
  SourceLineInfo local_b8;
  StringRef local_a8;
  int local_50;
  int local_4c;
  int *local_48;
  int local_40;
  vector<int,_std::allocator<int>_> local_30;
  int local_14;
  Proxy *local_10;
  
  args = &local_30;
  local_14 = in_EDX;
  local_10 = in_RSI;
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)0x14b7d0);
  diy::Master::Proxy::incoming
            ((Proxy *)in_stack_fffffffffffffd30.m_lhs,
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  this_00 = (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28);
  local_40 = 0;
  local_48 = (int *)0x0;
  while( true ) {
    args_1 = local_48;
    piVar1 = (int *)Catch::clara::std::vector<int,_std::allocator<int>_>::size(&local_30);
    if (piVar1 <= args_1) break;
    Catch::clara::std::vector<int,_std::allocator<int>_>::operator[](&local_30,(size_type)local_48);
    args_2 = diy::Master::Proxy::incoming
                       (in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    sVar2 = diy::MemoryBuffer::size((MemoryBuffer *)0x14b865);
    if (sVar2 != 0) {
      local_40 = local_40 + 1;
      Catch::clara::std::vector<int,_std::allocator<int>_>::operator[]
                (&local_30,(size_type)local_48);
      diy::Master::Proxy::dequeue<int>
                ((Proxy *)in_stack_fffffffffffffd30.m_lhs,(int)((ulong)this_00 >> 0x20),
                 in_stack_fffffffffffffd20.m_lhs,
                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (_func_void_BinaryBuffer_ptr_int_ptr *)in_stack_fffffffffffffd10);
      in_stack_fffffffffffffd40 = _stderr;
      in_stack_fffffffffffffd4c = diy::Master::Proxy::gid(local_10);
      local_50 = in_stack_fffffffffffffd4c;
      Catch::clara::std::vector<int,_std::allocator<int>_>::operator[]
                (&local_30,(size_type)local_48);
      fmt::v7::print<char[54],int,int&,int&,char>
                (in_stack_fffffffffffffd88,
                 (char (*) [54])CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 (int *)args,args_1,(int *)args_2);
      local_a8 = operator____catch_sr
                           ((char *)in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/rexchange.cpp"
                 ,0x5f);
      Catch::StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffd20.m_lhs,
                 (char *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      capturedExpression.m_size = (size_type)in_stack_fffffffffffffd30.m_lhs;
      capturedExpression.m_start = (char *)this_00;
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffffd20.m_lhs,
                 (StringRef *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (SourceLineInfo *)in_stack_fffffffffffffd10,capturedExpression,
                 (Flags)((ulong)in_stack_fffffffffffffd08 >> 0x20));
      in_stack_fffffffffffffd30 =
           Catch::Decomposer::operator<=((Decomposer *)in_stack_fffffffffffffd08,(int *)0x14b9d3);
      local_100 = in_stack_fffffffffffffd30.m_lhs;
      Catch::clara::std::vector<int,_std::allocator<int>_>::operator[]
                (&local_30,(size_type)local_48);
      Catch::ExprLhs<int_const&>::operator==
                ((ExprLhs<const_int_&> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40);
      Catch::AssertionHandler::handleExpr
                ((AssertionHandler *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
                ((BinaryExpr<const_int_&,_const_int_&> *)0x14ba3a);
      Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffd10);
      Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffffd10);
      local_160 = operator____catch_sr
                            ((char *)in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
      this_00 = &local_170;
      Catch::SourceLineInfo::SourceLineInfo
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/rexchange.cpp"
                 ,0x60);
      Catch::StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffd20.m_lhs,
                 (char *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      capturedExpression_00.m_size = (size_type)in_stack_fffffffffffffd30.m_lhs;
      capturedExpression_00.m_start = (char *)this_00;
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffffd20.m_lhs,
                 (StringRef *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (SourceLineInfo *)in_stack_fffffffffffffd10,capturedExpression_00,
                 (Flags)((ulong)in_stack_fffffffffffffd08 >> 0x20));
      local_1c0 = (local_4c + 2) % local_14;
      in_stack_fffffffffffffd20 =
           Catch::Decomposer::operator<=((Decomposer *)in_stack_fffffffffffffd08,(int *)0x14bb86);
      local_1b8 = in_stack_fffffffffffffd20.m_lhs;
      in_stack_fffffffffffffd1c = diy::Master::Proxy::gid(local_10);
      local_1c4 = in_stack_fffffffffffffd1c;
      Catch::ExprLhs<int_const&>::operator==
                ((ExprLhs<const_int_&> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40);
      Catch::AssertionHandler::handleExpr
                ((AssertionHandler *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
                ((BinaryExpr<const_int_&,_const_int_&> *)0x14bbfb);
      Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffd10);
      Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffffd10);
    }
    local_48 = (int *)((long)local_48 + 1);
  }
  local_230.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr((char *)in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
  this = &local_230;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/rexchange.cpp",
             0x62);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffd20.m_lhs,
             (char *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  capturedExpression_01.m_size = (size_type)in_stack_fffffffffffffd30.m_lhs;
  capturedExpression_01.m_start = (char *)this_00;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)in_stack_fffffffffffffd20.m_lhs,
             (StringRef *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
             (SourceLineInfo *)this,capturedExpression_01,
             (Flags)((ulong)in_stack_fffffffffffffd08 >> 0x20));
  expr = Catch::Decomposer::operator<=((Decomposer *)in_stack_fffffffffffffd08,(int *)0x14bdba);
  Catch::ExprLhs<int_const&>::operator==
            ((ExprLhs<const_int_&> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
             in_stack_fffffffffffffd40);
  Catch::AssertionHandler::handleExpr(this,(ITransientExpression *)expr.m_lhs);
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x14be14);
  Catch::AssertionHandler::complete(this);
  Catch::AssertionHandler::~AssertionHandler(this);
  Catch::clara::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20.m_lhs);
  return;
}

Assistant:

void remote_deq(Block*,
                const diy::Master::ProxyWithLink&   cp,
                int                                 nblocks)       // only need nblocks for testing
{
    std::vector<int> incoming_gids;
    cp.incoming(incoming_gids);
    int received = 0;
    for (size_t i = 0; i < incoming_gids.size(); i++)
        if (cp.incoming(incoming_gids[i]).size())
        {
            ++received;
            int recvd_data;
            // same as cp.dequeue(incoming_gids[i], recvd_data), but using this variant for
            // testing coverage.
            cp.dequeue(incoming_gids[i], &recvd_data, 1);
            fmt::print(stderr, "Remote dequeue: gid {} received value {} from gid {}\n",
                    cp.gid(), recvd_data, incoming_gids[i]);
            CHECK(recvd_data == incoming_gids[i]);
            CHECK((recvd_data + 2) % nblocks == cp.gid());
        }
    CHECK(received == 1);
}